

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overload_1.cxx
# Opt level: O3

int main(void)

{
  long *plVar1;
  Int *pIVar2;
  Int local_2c;
  Int local_28;
  Int local_24;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8ca,0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  Int::Int(&local_28,5);
  local_24.value = local_28.value;
  Int::operator_cast_to_int(&local_24);
  Int::operator_cast_to_double(&local_24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8ed,0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  Int::Int(&local_2c,0);
  local_24.value = local_2c.value;
  Int::Int(&local_28,0);
  local_2c = Int::operator++(&local_24,0);
  Int::operator_cast_to_int(&local_2c);
  pIVar2 = Int::operator++(&local_24);
  Int::operator_cast_to_int(pIVar2);
  local_2c.value = local_24.value;
  local_24.value = local_24.value + -1;
  Int::operator_cast_to_int(&local_2c);
  local_24.value = local_24.value + -1;
  Int::operator_cast_to_int(&local_24);
  pIVar2 = Int::operator++(&local_28);
  Int::operator_cast_to_int(pIVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_903,0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  Int::Int(&local_2c,5);
  local_24.value = local_2c.value;
  Int::Int(&local_2c,5);
  local_28.value = local_2c.value;
  pIVar2 = Int::operator+(&local_24,&local_28);
  Int::operator_cast_to_int(pIVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    int a = 5, b = 3, c = 10;
    double d = 12.3;
    Int origin_int_1, origin_int_2;

    /*** 代入&返却 ***/
    std::cout << "-------代入と返却-------" << std::endl;
    origin_int_1 = a; //代入
    origin_int_2 = origin_int_1; //代入
    b = origin_int_1; //int型で返却
    d = origin_int_1; //double型で返却

    std::cout << std::endl << std::endl << std::endl << std::endl;


    /*** インクリメント&デクリメント ***/
    std::cout << "-------インクリメントとデクリメント-------" << std::endl;
    origin_int_1 = 0;
    origin_int_2 = 0;
    a = origin_int_1++;
    a = ++origin_int_1;
    b = origin_int_1--;
    b = --origin_int_1;

    b = ++origin_int_2;
    std::cout << std::endl << std::endl << std::endl << std::endl;

    /*** 加算&減算 ***/
    std::cout << "-------加算&減算-------" << std::endl;
    a = 0;
    origin_int_1 = 5;
    origin_int_2 = 5;
    a = origin_int_1 + origin_int_2;
    std::cout << std::endl << std::endl << std::endl << std::endl;

    return 0;
}